

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockNamedValue.cpp
# Opt level: O1

MockNamedValue * __thiscall
MockNamedValueList::getValueByName(MockNamedValueList *this,SimpleString *name)

{
  MockNamedValueListNode *pMVar1;
  bool bVar2;
  SimpleString SStack_38;
  
  pMVar1 = this->head_;
  while( true ) {
    if (pMVar1 == (MockNamedValueListNode *)0x0) {
      return (MockNamedValue *)0x0;
    }
    (*pMVar1->data_->_vptr_MockNamedValue[0x17])(&SStack_38);
    bVar2 = operator==(&SStack_38,name);
    SimpleString::~SimpleString(&SStack_38);
    if (bVar2) break;
    pMVar1 = pMVar1->next_;
  }
  return pMVar1->data_;
}

Assistant:

MockNamedValue* MockNamedValueList::getValueByName(const SimpleString& name)
{
    for (MockNamedValueListNode * p = head_; p; p = p->next())
        if (p->getName() == name)
            return p->item();
    return NULLPTR;
}